

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::IsUnboundedFunction::IsUnboundedFunction(IsUnboundedFunction *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__IsUnboundedFunction_00e57018;
  return;
}

Assistant:

IsUnboundedFunction() :
        SystemSubroutine(KnownSystemName::IsUnbounded, SubroutineKind::Function) {}